

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

SP __thiscall pbrt::Scene::loadFrom(Scene *this,istream *inStream)

{
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar1;
  BinaryReader binary;
  
  BinaryReader::BinaryReader(&binary,inStream);
  if (binary.readEntities.
      super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      binary.readEntities.
      super__Vector_base<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::dynamic_pointer_cast<pbrt::Scene,pbrt::Entity>((shared_ptr<pbrt::Entity> *)this);
    BinaryReader::~BinaryReader(&binary);
    SVar1.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    SVar1.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (SP)SVar1.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"error in Scene::load - no entities");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Scene::SP Scene::loadFrom(std::istream &inStream)
  {
    BinaryReader binary(inStream);
    if (binary.readEntities.empty())
      throw std::runtime_error("error in Scene::load - no entities");
    Scene::SP scene = std::dynamic_pointer_cast<Scene>(binary.readEntities.back());
    assert(scene);
    return scene;
  }